

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmark.cpp
# Opt level: O1

void __thiscall
QBenchmarkTestMethodData::setResults
          (QBenchmarkTestMethodData *this,QList<QBenchmarkMeasurerBase::Measurement> *list,
          bool setByMacro)

{
  qreal *pqVar1;
  Measurement *pMVar2;
  long lVar3;
  char cVar4;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  qreal qVar8;
  undefined1 local_58 [31];
  bool local_39;
  long local_38;
  int iVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((list->d).size == 0) {
    qVar8 = 0.0;
    uVar6 = 0;
  }
  else {
    pMVar2 = (list->d).ptr;
    qVar8 = pMVar2->value;
    uVar6 = (ulong)pMVar2->metric;
  }
  local_39 = setByMacro;
  if (QBenchmarkGlobalData::current->iterationCount == -1) {
    if ((setByMacro) && (current->runOnce == false)) {
      if (QBenchmarkGlobalData::current->walltimeMinimum == -1) {
        iVar5 = (*QBenchmarkGlobalData::current->measurer->_vptr_QBenchmarkMeasurerBase[4])
                          (QBenchmarkGlobalData::current->measurer,uVar6);
        cVar4 = (char)iVar5;
      }
      else {
        cVar4 = (double)QBenchmarkGlobalData::current->walltimeMinimum < qVar8;
      }
      if (cVar4 == '\0') {
        this->iterationCount = this->iterationCount << 1;
        goto LAB_0011bc34;
      }
    }
    else {
      this->iterationCount = 1;
    }
  }
  this->resultAccepted = true;
LAB_0011bc34:
  this->valid = true;
  QList<QBenchmarkResult>::reserve(&this->results,(list->d).size);
  lVar3 = (list->d).size;
  if (lVar3 != 0) {
    pMVar2 = (list->d).ptr;
    lVar7 = 0;
    do {
      pqVar1 = (qreal *)((long)&pMVar2->value + lVar7);
      local_58._0_8_ = *pqVar1;
      local_58._8_8_ = pqVar1[1];
      QtPrivate::QMovableArrayOps<QBenchmarkResult>::
      emplace<QBenchmarkContext&,QBenchmarkMeasurerBase::Measurement&,int&,bool&>
                ((QMovableArrayOps<QBenchmarkResult> *)this,(this->results).d.size,
                 &QBenchmarkGlobalData::current->context,(Measurement *)local_58,
                 &this->iterationCount,&local_39);
      QList<QBenchmarkResult>::end(&this->results);
      lVar7 = lVar7 + 0x10;
    } while (lVar3 << 4 != lVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBenchmarkTestMethodData::setResults(const QList<QBenchmarkMeasurerBase::Measurement> &list,
                                          bool setByMacro)
{
    bool accepted = false;
    QBenchmarkMeasurerBase::Measurement firstMeasurement = {};
    if (!list.isEmpty())
        firstMeasurement = list.constFirst();

    // Always accept the result if the iteration count has been
    // specified on the command line with -iterations.
    if (QBenchmarkGlobalData::current->iterationCount != -1)
        accepted = true;

    else if (QBenchmarkTestMethodData::current->runOnce || !setByMacro) {
        iterationCount = 1;
        accepted = true;
    }

    // Test the result directly without calling the measurer if the minimum time
    // has been specified on the command line with -minimumvalue.
    else if (QBenchmarkGlobalData::current->walltimeMinimum != -1)
        accepted = (firstMeasurement.value > QBenchmarkGlobalData::current->walltimeMinimum);
    else
        accepted = QBenchmarkGlobalData::current->measurer->isMeasurementAccepted(firstMeasurement);

    // Accept the result or double the number of iterations.
    if (accepted)
        resultAccepted = true;
    else
        iterationCount *= 2;

    valid = true;
    results.reserve(list.size());
    for (auto m : list)
        results.emplaceBack(QBenchmarkGlobalData::current->context, m, iterationCount, setByMacro);
}